

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManSetLevels(Gia_Man_t *p,Vec_Int_t *vCiLevels)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  
  if (vCiLevels == (Vec_Int_t *)0x0) {
    iVar5 = Gia_ManLevelNum(p);
    return iVar5;
  }
  if (vCiLevels->nSize != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vCiLevels) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x234,"int Gia_ManSetLevels(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCi(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = Vec_IntEntry(vCiLevels,iVar5);
    Gia_ObjSetLevel(p,pGVar3,iVar1);
    iVar1 = p->nLevels;
    iVar2 = Gia_ObjLevel(p,pGVar3);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    p->nLevels = iVar2;
  }
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManObj(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = (int)*(ulong *)pGVar3;
    uVar4 = *(ulong *)pGVar3 & 0x1fffffff;
    if (uVar4 == 0x1fffffff || iVar1 < 0) {
      if (iVar1 < 0 && (int)uVar4 != 0x1fffffff) {
        Gia_ObjSetCoLevel(p,pGVar3);
        goto LAB_00213edb;
      }
    }
    else {
      Gia_ObjSetGateLevel(p,pGVar3);
LAB_00213edb:
      iVar1 = p->nLevels;
      iVar2 = Gia_ObjLevel(p,pGVar3);
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      p->nLevels = iVar2;
    }
  }
  return p->nLevels;
}

Assistant:

int Gia_ManSetLevels( Gia_Man_t * p, Vec_Int_t * vCiLevels )  
{
    Gia_Obj_t * pObj;
    int i;
    if ( vCiLevels == NULL )
        return Gia_ManLevelNum( p );
    assert( Vec_IntSize(vCiLevels) == Gia_ManCiNum(p) );
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ObjSetLevel( p, pObj, Vec_IntEntry(vCiLevels, i) );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else continue;
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}